

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead.cc
# Opt level: O0

void __thiscall
pstack::Procman::FileEntries::iterator::iterator(iterator *this,FileEntries *entries,iterator pos)

{
  FileEntries *entries_local;
  iterator *this_local;
  iterator pos_local;
  
  this->entries = entries;
  this->fetched = false;
  this->nameoff = 0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstack::Procman::FileEntry,_true>
            (&this->cur);
  (this->entriesIterator).arrayp = pos.arrayp;
  (this->entriesIterator).idx = pos.idx;
  return;
}

Assistant:

FileEntries::iterator::iterator(const FileEntries &entries, ReaderArray<FileEntry>::iterator pos)
        : entries(entries)
        , entriesIterator(pos) {
}